

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlNodeSetContentInternal(xmlNodePtr cur,xmlChar *content,int len)

{
  xmlElementType xVar1;
  int iVar2;
  xmlChar *content_00;
  
  if (cur == (xmlNodePtr)0x0) {
    return 1;
  }
  xVar1 = cur->type;
  if (xVar1 < XML_NOTATION_NODE) {
    if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
      if (((0x806U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0) &&
         (iVar2 = xmlNodeParseContentInternal(cur->doc,cur,content,len,(xmlNodePtr *)0x0), iVar2 < 0
         )) {
        return -1;
      }
    }
    else {
      if (content == (xmlChar *)0x0) {
        content_00 = (xmlChar *)0x0;
      }
      else {
        if (len < 0) {
          content_00 = xmlStrdup(content);
        }
        else {
          content_00 = xmlStrndup(content,len);
        }
        if (content_00 == (xmlChar *)0x0) {
          return -1;
        }
      }
      xmlTextSetContent(cur,content_00);
    }
  }
  return 0;
}

Assistant:

static int
xmlNodeSetContentInternal(xmlNodePtr cur, const xmlChar *content, int len) {
    if (cur == NULL) {
	return(1);
    }
    switch (cur->type) {
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ELEMENT_NODE:
        case XML_ATTRIBUTE_NODE:
            if (xmlNodeParseContent(cur, content, len) < 0)
                return(-1);
	    break;

        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE: {
            xmlChar *copy = NULL;

	    if (content != NULL) {
                if (len < 0)
                    copy = xmlStrdup(content);
                else
		    copy = xmlStrndup(content, len);
                if (copy == NULL)
                    return(-1);
	    }

            xmlTextSetContent(cur, copy);
	    break;
        }

        default:
            break;
    }

    return(0);
}